

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::save
               (BinaryBuffer *bb,Vector *v)

{
  pointer p;
  long lVar1;
  size_t s;
  long local_20;
  
  local_20 = (long)(v->super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v->super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 6;
  (*bb->_vptr_BinaryBuffer[2])(bb,&local_20,8);
  if (local_20 != 0) {
    p = (v->super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>)._M_impl.
        super__Vector_impl_data._M_start;
    lVar1 = (long)(v->super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)p;
    if (lVar1 != 0) {
      lVar1 = lVar1 >> 6;
      do {
        Serialization<diy::DynamicPoint<int,_4UL>_>::save(bb,&p->super_DynamicPoint<int,_4UL>);
        p = p + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }